

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramsurface.hpp
# Opt level: O0

bool __thiscall ParamSurface::intersect(ParamSurface *this,Ray *ray,Hit *result)

{
  vec3f *pvVar1;
  double dVar2;
  mat3f a;
  void *in_RDX;
  long in_RSI;
  long *in_RDI;
  float fVar3;
  float fVar4;
  point pVar5;
  vec3f vVar6;
  vec3f N;
  vec3f delt;
  int _;
  vec3f dpdv;
  vec3f dpdu;
  vec3f p;
  float v;
  float u;
  float t;
  bool boolres;
  Ray forwardray;
  Hit tmpresult;
  Hit *in_stack_fffffffffffffcc0;
  vec3f *in_stack_fffffffffffffcc8;
  vec3f *in_stack_fffffffffffffcd0;
  float in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  Hit *in_stack_fffffffffffffce0;
  bool local_311;
  vec3f *in_stack_fffffffffffffcf8;
  Ray *in_stack_fffffffffffffd00;
  vec2f local_2f0;
  undefined1 local_2e8 [72];
  undefined8 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined8 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  float in_stack_fffffffffffffd80;
  vec3f local_1f0;
  undefined1 local_1e0 [16];
  vec3f *local_1d0;
  vec3f *pvStack_1c8;
  float local_1c0;
  Ray local_1b8;
  undefined8 local_194;
  float local_18c;
  vec3f local_188;
  undefined8 local_178;
  float local_170;
  undefined8 local_168;
  float local_160;
  undefined8 local_158;
  float local_150;
  undefined8 local_148;
  float local_140;
  vec3f local_138;
  int local_12c;
  vec3f local_128;
  vec3f local_11c;
  vec3f local_110;
  float local_100;
  float local_fc;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e4;
  float local_dc;
  float local_d8;
  byte local_d1;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  Ray local_80;
  undefined1 local_68 [40];
  float local_40;
  float local_3c;
  void *local_20;
  long local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  Primitive::Hit::Hit(in_stack_fffffffffffffcc0);
  pVar5 = Ray::atParam(in_stack_fffffffffffffd00,(float)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  local_b8 = pVar5.z;
  local_c0 = pVar5._0_8_;
  local_c8 = *(undefined4 *)(local_18 + 0x14);
  pvVar1 = (vec3f *)(local_18 + 0xc);
  local_d0._0_4_ = pvVar1->x;
  local_d0._4_4_ = pvVar1->y;
  local_b0 = local_d0;
  local_a8 = local_c8;
  local_a0 = local_c0;
  local_98 = local_b8;
  local_90 = local_c0;
  local_88 = local_b8;
  Ray::Ray(&local_80,pVar5,*pvVar1);
  local_d1 = (*(code *)**(undefined8 **)in_RDI[1])((undefined8 *)in_RDI[1],&local_80,local_68);
  local_d1 = local_d1 & 1;
  if (local_d1 == 0) {
    local_1 = false;
  }
  else {
    vVar6 = ::operator-(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    local_f0 = vVar6.z;
    local_f8 = vVar6._0_8_;
    local_e4 = local_f8;
    local_dc = local_f0;
    local_d8 = norm((vec3f *)0x17d469);
    dVar2 = (double)local_40;
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    if (1.0 <= dVar2) {
      dVar2 = 1.0;
    }
    local_fc = (float)dVar2;
    dVar2 = (double)local_3c;
    if (dVar2 <= 0.0) {
      dVar2 = 0.0;
    }
    if (1.0 <= dVar2) {
      dVar2 = 1.0;
    }
    local_100 = (float)dVar2;
    vec3f::vec3f(&local_110);
    vec3f::vec3f(&local_11c);
    vec3f::vec3f(&local_128);
    for (local_12c = 0; fVar3 = (float)((ulong)in_stack_fffffffffffffcf8 >> 0x20), local_12c < 5;
        local_12c = local_12c + 1) {
      in_stack_fffffffffffffcf8 = &local_128;
      fVar3 = local_100;
      local_158 = (**(code **)(*in_RDI + 0x18))(local_fc);
      local_150 = fVar3;
      local_148 = local_158;
      local_140 = fVar3;
      pVar5 = Ray::atParam(in_stack_fffffffffffffd00,
                           (float)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      local_170 = pVar5.z;
      local_178 = pVar5._0_8_;
      local_168 = local_178;
      local_160 = local_170;
      vVar6 = ::operator-(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      local_188.z = vVar6.z;
      local_188._0_8_ = vVar6._0_8_;
      local_138._0_8_ = local_188._0_8_;
      local_138.z = local_188.z;
      local_110._0_8_ = local_188._0_8_;
      local_110.z = local_188.z;
      vVar6 = ::operator-((vec3f *)in_stack_fffffffffffffcc0);
      local_1f0.z = vVar6.z;
      local_1f0._0_8_ = vVar6._0_8_;
      mat3f::mat3f((mat3f *)local_1e0,&local_1f0,&local_11c,in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffd00 = &local_1b8;
      a.data[0][2] = (float)in_stack_fffffffffffffd68;
      a.data[0][0] = (float)(int)in_stack_fffffffffffffd60;
      a.data[0][1] = (float)(int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
      a.data[1][0] = (float)in_stack_fffffffffffffd6c;
      a.data[1][1] = (float)(int)in_stack_fffffffffffffd70;
      a.data[1][2] = (float)(int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
      a.data[2][0] = (float)in_stack_fffffffffffffd78;
      a.data[2][1] = (float)in_stack_fffffffffffffd7c;
      a.data[2][2] = in_stack_fffffffffffffd80;
      in_stack_fffffffffffffcc0 = (Hit *)local_1e0._8_8_;
      in_stack_fffffffffffffcc8 = local_1d0;
      in_stack_fffffffffffffcd0 = pvStack_1c8;
      in_stack_fffffffffffffcd8 = local_1c0;
      inverse(a);
      vVar6 = ::operator*((mat3f *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_18c = vVar6.z;
      local_194._0_4_ = vVar6.x;
      local_d8 = local_d8 - (float)local_194;
      local_194._4_4_ = vVar6.y;
      dVar2 = (double)(local_fc - local_194._4_4_);
      if (dVar2 <= 0.0) {
        dVar2 = 0.0;
      }
      if (1.0 <= dVar2) {
        dVar2 = 1.0;
      }
      local_fc = (float)dVar2;
      dVar2 = (double)(local_100 - local_18c);
      if (dVar2 <= 0.0) {
        dVar2 = 0.0;
      }
      if (1.0 <= dVar2) {
        dVar2 = 1.0;
      }
      local_100 = (float)dVar2;
      local_194 = vVar6._0_8_;
    }
    fVar4 = local_100;
    local_110._0_8_ = (**(code **)(*in_RDI + 0x18))(local_fc,in_RDI,&local_11c,&local_128);
    local_110.z = fVar4;
    Ray::atParam(in_stack_fffffffffffffd00,fVar3);
    ::operator-(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    fVar3 = norm((vec3f *)0x17d8d2);
    local_311 = fVar3 < 1e-06 && 0.0 < local_d8;
    if (local_311) {
      cross(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      normalized(in_stack_fffffffffffffcd0);
      vec2f::vec2f(&local_2f0,local_fc,local_100);
      Primitive::Hit::Hit(in_stack_fffffffffffffce0,
                          (point *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                          in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                          (vec2f *)in_stack_fffffffffffffcc0);
      memcpy(local_20,local_2e8,0x48);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		Hit tmpresult;
		Ray forwardray (ray.atParam(1e-2), ray.dir);
		bool boolres = mesh->intersect(forwardray, &tmpresult);
		if (!boolres) return false;
		// determine initial point
		float t = norm(tmpresult.p - ray.origin);
		float u = tmpresult.uv.x;
		float v = tmpresult.uv.y;
		u = fmin(1, fmax(0, u));
		v = fmin(1, fmax(0, v));
		vec3f p, dpdu, dpdv;
		// solve eqn(t,u,v): f(u,v) - origin - t * dir = 0
		for (int _=0; _<5; ++_)
		{
			p = surface(u,v,dpdu,dpdv) - ray.atParam(t);
			// vec3f t1,t2;
			// auto dpdu1 = (surface(u+1e-4,v,t1,t2)-surface(u,v,dpdu,dpdv))/1e-4;
			// auto dpdv1 = (surface(u,v+1e-4,t1,t2)-surface(u,v,dpdu,dpdv))/1e-4;
			// console.log(u,v);
			// console.log(dpdu, dpdv);
			// console.log(dpdu1, dpdv1);
			// console.log(norm(dpdu-dpdu1)/norm(dpdu), norm(dpdv-dpdv1)/norm(dpdv));
			// console.log(_,":",norm(p),",  ",t,u,v);
			// for (int i=0; i<3; ++i) for (int j=0; j<3; ++j)
			// console.log((inverse(mat3f(-ray.dir, dpdu, dpdv))*mat3f(-ray.dir, dpdu, dpdv))[i][j]);
			vec3f delt = inverse(mat3f(-ray.dir, dpdu, dpdv)) * p;
			t -= delt.x;
			u = fmin(1, fmax(0, u - delt.y));
			// v = v - delt.z;
			v = fmin(1, fmax(0, v - delt.z));
		}
		p = surface(u,v,dpdu,dpdv);
		if (norm(p-ray.atParam(t)) < 1e-6 && t>0) {
			vec3f N = normalized(cross(dpdu,dpdv));
			*result = {p,N,N,vec2f(u,v)};
			return true;
		}
		return false;
	}